

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsErrors.cxx
# Opt level: O3

void cmCMakePresetsErrors::TOOLCHAIN_FILE_UNSUPPORTED(cmJSONState *state)

{
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"File version must be 3 or higher for toolchainFile preset support"
             ,"");
  cmJSONState::AddError(state,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void TOOLCHAIN_FILE_UNSUPPORTED(cmJSONState* state)
{
  state->AddError("File version must be 3 or higher for toolchainFile preset "
                  "support");
}